

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.h
# Opt level: O0

void __thiscall OutputContext::Print(OutputContext *this,char *format,__va_list_tag *args)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char **ppcVar5;
  bool bVar6;
  char local_111;
  uint *local_110;
  undefined8 *local_f8;
  uint *local_e0;
  undefined8 *local_c8;
  char **ppcStack_a0;
  int length;
  char *result;
  char forward [16];
  char *symbols;
  char *curr;
  char reverse [16];
  uint local_60;
  uint uvalue;
  int value;
  uint width;
  bool leadingZeroes;
  char *tmpPos;
  char *str_1;
  uint length_1;
  char *str;
  char *start;
  char *pos;
  __va_list_tag *args_local;
  char *format_local;
  OutputContext *this_local;
  
  start = format;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            bVar6 = false;
            if (*start != '\0') {
              bVar6 = *start != '%';
            }
            if (!bVar6) break;
            start = start + 1;
          }
          if (start != format) {
            Print(this,format,(int)start - (int)format);
          }
          if ((*start != '%') || (start[1] != 's')) break;
          start = start + 2;
          uVar2 = args->gp_offset;
          if (uVar2 < 0x29) {
            local_c8 = (undefined8 *)((long)(int)uVar2 + (long)args->reg_save_area);
            args->gp_offset = uVar2 + 8;
          }
          else {
            local_c8 = (undefined8 *)args->overflow_arg_area;
            args->overflow_arg_area = local_c8 + 1;
          }
          Print(this,(char *)*local_c8);
          format = start;
        }
        if ((*start != '%') || (((start[1] != '.' || (start[2] != '*')) || (start[3] != 's'))))
        break;
        start = start + 4;
        uVar2 = args->gp_offset;
        if (uVar2 < 0x29) {
          local_e0 = (uint *)((long)(int)uVar2 + (long)args->reg_save_area);
          args->gp_offset = uVar2 + 8;
        }
        else {
          local_e0 = (uint *)args->overflow_arg_area;
          args->overflow_arg_area = local_e0 + 2;
        }
        uVar2 = *local_e0;
        uVar3 = args->gp_offset;
        if (uVar3 < 0x29) {
          local_f8 = (undefined8 *)((long)(int)uVar3 + (long)args->reg_save_area);
          args->gp_offset = uVar3 + 8;
        }
        else {
          local_f8 = (undefined8 *)args->overflow_arg_area;
          args->overflow_arg_area = local_f8 + 1;
        }
        Print(this,(char *)*local_f8,uVar2);
        format = start;
      }
      if ((*start != '%') || (start[1] != '%')) break;
      start = start + 2;
      Print(this,'%');
      format = start;
    }
    if (*start != '%') break;
    _width = start + 1;
    cVar1 = *_width;
    if (cVar1 == '0') {
      _width = start + 2;
    }
    uvalue = 0;
    if ((int)*_width - 0x30U < 10) {
      uvalue = (int)*_width - 0x30;
      _width = _width + 1;
    }
    if ((*_width != 'd') && (*_width != 'x')) goto LAB_00185534;
    start = _width + 1;
    uVar2 = args->gp_offset;
    if (uVar2 < 0x29) {
      local_110 = (uint *)((long)(int)uVar2 + (long)args->reg_save_area);
      args->gp_offset = uVar2 + 8;
    }
    else {
      local_110 = (uint *)args->overflow_arg_area;
      args->overflow_arg_area = local_110 + 2;
    }
    local_60 = *local_110;
    if ((*_width == 'd') && ((int)local_60 < 0)) {
      Print(this,'-');
    }
    if ((*_width == 'd') && ((int)local_60 < 0)) {
      local_60 = -local_60;
    }
    if (*_width == 'd') {
      curr._0_1_ = (char)((ulong)local_60 % 10) + '0';
      symbols = (char *)((long)&curr + 1);
      while (local_60 = local_60 / 10, local_60 != 0) {
        *symbols = (char)((ulong)local_60 % 10) + '0';
        symbols = symbols + 1;
      }
    }
    else {
      forward._8_8_ = anon_var_dwarf_d8ad;
      curr._0_1_ = "0123456789abcdef"[local_60 & 0xf];
      symbols = (char *)((long)&curr + 1);
      while (local_60 = local_60 >> 4, local_60 != 0) {
        *symbols = "0123456789abcdef"[local_60 & 0xf];
        symbols = symbols + 1;
      }
    }
    while ((uint)((int)symbols - (int)&curr) < uvalue) {
      local_111 = '0';
      if (cVar1 != '0') {
        local_111 = ' ';
      }
      *symbols = local_111;
      symbols = symbols + 1;
    }
    ppcStack_a0 = &result;
    do {
      symbols = symbols + -1;
      ppcVar5 = (char **)((long)ppcStack_a0 + 1);
      *(char *)ppcStack_a0 = *symbols;
      ppcStack_a0 = ppcVar5;
    } while ((char **)symbols != &curr);
    *(undefined1 *)ppcVar5 = 0;
    Print(this,(char *)&result);
    format = start;
  }
  if (*start == '\0') {
    return;
  }
LAB_00185534:
  iVar4 = vsnprintf(this->tempBuf,(ulong)(this->tempBufSize - 1),start,args);
  if ((-1 < iVar4) && (iVar4 <= (int)(this->tempBufSize - 1))) {
    Print(this,this->tempBuf);
    return;
  }
  (*this->writeStream)(this->stream,this->outputBuf,this->outputBufPos);
  this->outputBufPos = 0;
  (*this->writeStream)(this->stream,this->tempBuf,this->tempBufSize - 1);
  __assert_fail("!\"temporary buffer is too small\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Output.h"
                ,0xe4,"void OutputContext::Print(const char *, __va_list_tag *)");
}

Assistant:

void Print(const char *format, va_list args)
	{
		const char *pos = format;

		for(;;)
		{
			const char *start = pos;

			while(*pos && *pos != '%')
				pos++;

			if(pos != start)
				Print(start, unsigned(pos - start));

			if(pos[0] == '%' && pos[1] == 's')
			{
				pos += 2;

				char *str = va_arg(args, char*);

				Print(str);
			}
			else if(pos[0] == '%' && pos[1] == '.' && pos[2] == '*' && pos[3] == 's')
			{
				pos += 4;

				unsigned length = va_arg(args, unsigned);
				char *str = va_arg(args, char*);

				Print(str, length);
			}
			else if(pos[0] == '%' && pos[1] == '%')
			{
				pos += 2;

				Print('%');
			}
			else if(pos[0] == '%')
			{
				const char *tmpPos = pos + 1;

				bool leadingZeroes = false;

				if(*tmpPos == '0')
				{
					leadingZeroes = true;

					tmpPos++;
				}

				unsigned width = 0;

				if(unsigned(*tmpPos - '0') < 10)
				{
					width = unsigned(*tmpPos - '0');

					tmpPos++;
				}

				if(*tmpPos == 'd' || *tmpPos == 'x')
				{
					pos = tmpPos + 1;

					int value = va_arg(args, int);

					if(*tmpPos == 'd' && value < 0)
						Print('-');

					unsigned uvalue;

					if(*tmpPos == 'd' && value < 0)
						uvalue = -value;
					else
						uvalue = value;

					char reverse[16];

					char *curr = reverse;

					if(*tmpPos == 'd')
					{
						*curr++ = (char)((uvalue % 10) + '0');

						while(uvalue /= 10)
							*curr++ = (char)((uvalue % 10) + '0');
					}
					else
					{
						const char *symbols = "0123456789abcdef";

						*curr++ = symbols[uvalue % 16];

						while(uvalue /= 16)
							*curr++ = symbols[uvalue % 16];
					}

					while(unsigned(curr - reverse) < width)
						*curr++ = leadingZeroes ? '0' : ' ';

					char forward[16];

					char *result = forward;

					do
					{
						--curr;
						*result++ = *curr;
					}
					while(curr != reverse);

					*result = 0;

					Print(forward);
				}
				else
				{
					break;
				}
			}
			else if(pos[0] == 0)
			{
				return;
			}
			else
			{
				break;
			}
		}

		int length = vsnprintf(tempBuf, tempBufSize - 1, pos, args);

		if(length < 0 || length > int(tempBufSize) - 1)
		{
			writeStream(stream, outputBuf, outputBufPos);
			outputBufPos = 0;

			writeStream(stream, tempBuf, tempBufSize - 1);

			assert(!"temporary buffer is too small");
		}
		else
		{
			Print(tempBuf);
		}
	}